

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcViewportArrayTests.cpp
# Opt level: O1

IterateResult __thiscall
glcts::ViewportArray::ScissorTestStateAPI::iterate(ScissorTestStateAPI *this)

{
  uchar uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  long lVar5;
  NotSupportedError *this_00;
  char *description;
  ulong uVar6;
  bool test_result;
  GLint max_viewports;
  vector<unsigned_char,_std::allocator<unsigned_char>_> scissor_test_states_a;
  vector<unsigned_char,_std::allocator<unsigned_char>_> scissor_test_states_b;
  bool local_6d;
  int local_6c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  long lVar4;
  
  if ((this->super_TestCaseBase).m_is_viewport_array_supported != false) {
    iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    lVar4 = CONCAT44(extraout_var,iVar2);
    local_6d = true;
    local_6c = 0;
    (**(code **)(lVar4 + 0x868))(0x825b,&local_6c);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"GetIntegerv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x921);
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_68,(long)local_6c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_48,(long)local_6c);
    getScissorTestStates(this,local_6c,&local_68);
    if (0 < local_6c) {
      uVar6 = 0;
      do {
        uVar1 = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        if (uVar1 == '\0') {
          (**(code **)(lVar4 + 0x618))(0xc11,uVar6 & 0xffffffff);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"Enablei",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                          ,0x939);
        }
        else {
          (**(code **)(lVar4 + 0x520))(0xc11,uVar6 & 0xffffffff);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"Disablei",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                          ,0x940);
        }
        local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = uVar1 == '\0';
        getScissorTestStates(this,local_6c,&local_48);
        compareScissorTestStates(this,&local_68,&local_48,"1st toggle",&local_6d);
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)local_6c);
    }
    if (0 < local_6c) {
      uVar6 = 0;
      do {
        uVar1 = local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar6];
        if (uVar1 == '\0') {
          (**(code **)(lVar4 + 0x618))(0xc11,uVar6 & 0xffffffff);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"Enablei",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                          ,0x94e);
        }
        else {
          (**(code **)(lVar4 + 0x520))(0xc11,uVar6 & 0xffffffff);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"Disablei",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                          ,0x955);
        }
        local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[uVar6] = uVar1 == '\0';
        getScissorTestStates(this,local_6c,&local_48);
        compareScissorTestStates(this,&local_68,&local_48,"2nd toggle",&local_6d);
        uVar6 = uVar6 + 1;
      } while ((long)uVar6 < (long)local_6c);
    }
    if (0 < local_6c) {
      lVar5 = 0;
      do {
        local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5] = '\x01';
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_6c);
    }
    (**(code **)(lVar4 + 0x5e0))(0xc11);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Enable",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x968);
    getScissorTestStates(this,local_6c,&local_48);
    compareScissorTestStates(this,&local_68,&local_48,"1st enable all",&local_6d);
    if (0 < local_6c) {
      lVar5 = 0;
      do {
        local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5] = '\0';
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_6c);
    }
    (**(code **)(lVar4 + 0x4e8))(0xc11);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Disable",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x977);
    getScissorTestStates(this,local_6c,&local_48);
    compareScissorTestStates(this,&local_68,&local_48,"Disable all",&local_6d);
    if (0 < local_6c) {
      lVar5 = 0;
      do {
        local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar5] = '\x01';
        lVar5 = lVar5 + 1;
      } while (lVar5 < local_6c);
    }
    (**(code **)(lVar4 + 0x5e0))(0xc11);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"Enable",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
                    ,0x986);
    getScissorTestStates(this,local_6c,&local_48);
    compareScissorTestStates(this,&local_68,&local_48,"2nd enable all",&local_6d);
    description = "Fail";
    if (local_6d != QP_TEST_RESULT_PASS) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              (((this->super_TestCaseBase).m_context)->m_testCtx,local_6d ^ QP_TEST_RESULT_FAIL,
               description);
    if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    return STOP;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Viewport array functionality not supported, skipping",
             fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcViewportArrayTests.cpp"
             ,0x915);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ScissorTestStateAPI::iterate()
{
	if (!m_is_viewport_array_supported)
	{
		throw tcu::NotSupportedError(VIEWPORT_ARRAY_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result */
	bool test_result = true;

	GLint max_viewports = 0;

	gl.getIntegerv(GL_MAX_VIEWPORTS, &max_viewports);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	std::vector<GLboolean> scissor_test_states_a;
	std::vector<GLboolean> scissor_test_states_b;

	scissor_test_states_a.resize(max_viewports);
	scissor_test_states_b.resize(max_viewports);

	/*
	 *   - get initial state of SCISSOR_TEST for all MAX_VIEWPORTS indices;
	 *   - for each index:
	 *     * toggle SCISSOR_TEST,
	 *     * get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 *   - for each index:
	 *     * toggle SCISSOR_TEST,
	 *     * get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	getScissorTestStates(max_viewports, scissor_test_states_a);

	for (GLint i = 0; i < max_viewports; ++i)
	{
		if (GL_FALSE == scissor_test_states_a[i])
		{
			gl.enablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Enablei");

			scissor_test_states_a[i] = GL_TRUE;
		}
		else
		{
			gl.disablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Disablei");

			scissor_test_states_a[i] = GL_FALSE;
		}

		getScissorTestStates(max_viewports, scissor_test_states_b);
		compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "1st toggle", test_result);
	}

	for (GLint i = 0; i < max_viewports; ++i)
	{
		if (GL_FALSE == scissor_test_states_a[i])
		{
			gl.enablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Enablei");

			scissor_test_states_a[i] = GL_TRUE;
		}
		else
		{
			gl.disablei(GL_SCISSOR_TEST, i);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Disablei");

			scissor_test_states_a[i] = GL_FALSE;
		}

		getScissorTestStates(max_viewports, scissor_test_states_b);
		compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "2nd toggle", test_result);
	}

	/*
	 *   - enable SCISSOR_TEST for all indices at once with Enable;
	 *   - get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_test_states_a[i] = GL_TRUE;
	}

	gl.enable(GL_SCISSOR_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Enable");

	getScissorTestStates(max_viewports, scissor_test_states_b);
	compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "1st enable all", test_result);

	/*
	 *   - disable SCISSOR_TEST for all indices at once with Disable;
	 *   - get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_test_states_a[i] = GL_FALSE;
	}

	gl.disable(GL_SCISSOR_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Disable");

	getScissorTestStates(max_viewports, scissor_test_states_b);
	compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "Disable all", test_result);

	/*
	 *   - enable SCISSOR_TEST for all indices at once with Enable;
	 *   - get state of SCISSOR_TEST for all MAX_VIEWPORTS indices and verify;
	 */
	for (GLint i = 0; i < max_viewports; ++i)
	{
		scissor_test_states_a[i] = GL_TRUE;
	}

	gl.enable(GL_SCISSOR_TEST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Enable");

	getScissorTestStates(max_viewports, scissor_test_states_b);
	compareScissorTestStates(scissor_test_states_a, scissor_test_states_b, "2nd enable all", test_result);

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}